

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O1

optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
* __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>
::
Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
::next_raw(optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
           *__return_storage_ptr__,
          Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
          *this,bool all_cofacets)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_> *pBVar5;
  int *piVar6;
  int iVar7;
  char cVar8;
  char cVar9;
  ulong uVar10;
  logic_error *this_00;
  int *piVar11;
  coefficient_t _coefficient;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  char cVar16;
  float *pfVar17;
  long lVar18;
  simplex_t sVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  
  iVar3 = this->j;
  cVar16 = this->k;
  bVar20 = cVar16 <= iVar3;
  if (cVar16 <= iVar3 && !all_cofacets) {
    if (cVar16 == '\0') {
      uVar10 = 1;
    }
    else {
      uVar10 = (long)iVar3 <<
               ((cVar16 + -1) * (char)this->simplex_encoding->bits_per_vertex & 0x3fU);
    }
    bVar20 = this->idx_below < uVar10;
  }
  if (bVar20) {
    pBVar5 = this->simplex_encoding;
    iVar3 = this->j;
    bVar2 = this->k;
    uVar10 = this->idx_below;
    sVar19 = this->idx_above;
    lVar15 = (long)iVar3 << 0x20;
    cVar16 = bVar2 + 1;
    lVar18 = 0;
    while( true ) {
      lVar1 = iVar3 + lVar18;
      cVar9 = (char)((ulong)bVar2 + lVar18);
      iVar7 = (int)lVar18;
      cVar8 = (char)lVar18;
      if (cVar9 == '\0') {
        uVar12 = 1;
      }
      else {
        uVar12 = lVar1 << ((bVar2 + cVar8 + -1) * (char)pBVar5->bits_per_vertex & 0x3f);
      }
      if (uVar10 < uVar12) break;
      lVar13 = 1;
      lVar14 = 1;
      if (cVar9 != '\0') {
        lVar14 = lVar1 << ((bVar2 + cVar8 + -1) * (char)pBVar5->bits_per_vertex & 0x3f);
      }
      uVar10 = uVar10 - lVar14;
      this->idx_below = uVar10;
      bVar20 = cVar16 != '\0';
      cVar16 = cVar16 + -1;
      if (bVar20) {
        lVar13 = lVar1 << (cVar9 * (char)pBVar5->bits_per_vertex & 0x3fU);
      }
      sVar19 = sVar19 + lVar13;
      this->idx_above = sVar19;
      this->j = iVar3 + -1 + iVar7;
      this->k = bVar2 + cVar8 + -1;
      lVar15 = lVar15 + -0x100000000;
      lVar18 = lVar18 + -1;
      if (cVar16 == '\0') {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,"");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
    fVar21 = (this->simplex).
             super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
             .first;
    piVar11 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar6 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar11 != piVar6) {
      do {
        iVar4 = *piVar11;
        if (iVar3 + iVar7 == iVar4) {
          fVar22 = 0.0;
        }
        else {
          if (iVar3 + iVar7 < iVar4) {
            pfVar17 = (float *)((long)(this->dist->rows).
                                      super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                                      super__Vector_impl_data._M_start[iVar4] + (lVar15 >> 0x1e));
          }
          else {
            pfVar17 = (float *)((long)iVar4 * 4 +
                               *(long *)((long)(this->dist->rows).
                                               super__Vector_base<float_*,_std::allocator<float_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start +
                                        (lVar15 >> 0x1d)));
          }
          fVar22 = *pfVar17;
        }
        if (fVar22 <= fVar21) {
          fVar22 = fVar21;
        }
        fVar21 = fVar22;
        piVar11 = piVar11 + 1;
      } while (piVar11 != piVar6);
    }
    this->j = iVar3 + iVar7 + -1;
    if (cVar16 == '\0') {
      lVar15 = 1;
    }
    else {
      lVar15 = (lVar15 >> 0x20) << ((char)pBVar5->bits_per_vertex * cVar9 & 0x3fU);
    }
    iVar3 = this->parent->bits_for_coeff;
    _coefficient = (~(uint)(-1L << ((byte)iVar3 & 0x3f)) &
                   (uint)(this->simplex).
                         super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
                         .second.content) + 1;
    if (((ulong)bVar2 + lVar18 & 1) != 0) {
      _coefficient = this->parent->modulus - _coefficient;
    }
    entry_with_coeff_t::entry_with_coeff_t
              ((entry_with_coeff_t *)
               &(__return_storage_ptr__->
                super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_true,_true>
                )._M_payload.
                super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
                ._M_payload._M_value.
                super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
                .second,this->idx_above + uVar10 + lVar15,_coefficient,iVar3);
    (__return_storage_ptr__->
    super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_true,_true>
    )._M_payload.
    super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
    ._M_payload._M_value.
    super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
    .first = fVar21;
    bVar20 = true;
  }
  else {
    bVar20 = false;
  }
  (__return_storage_ptr__->
  super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_true,_true>
  )._M_payload.
  super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
  ._M_engaged = bVar20;
  return __return_storage_ptr__;
}

Assistant:

std::optional<diameter_entry_t> next_raw(bool all_cofacets = true) {
      if (!has_next(all_cofacets)) return std::nullopt;
      // this requires simplex_encoding(x,0)>0
      while (simplex_encoding(j, k) <= idx_below) {
        idx_below -= simplex_encoding(j, k);
        idx_above += simplex_encoding(j, k + 1);
        --j;
        --k;
        GUDHI_assert(k != -1);
      }
      value_t cofacet_diameter = get_diameter(simplex);
      // The order of j and i matters for performance
      for (vertex_t i : vertices) cofacet_diameter = std::max(cofacet_diameter, dist(j, i));
      simplex_t cofacet_index = idx_above + simplex_encoding(j--, k + 1) + idx_below;
      coefficient_t cofacet_coefficient = parent.get_coefficient(simplex);
      if (k & 1) cofacet_coefficient = parent.modulus - cofacet_coefficient;
      return parent.make_diameter_entry(cofacet_diameter, cofacet_index, cofacet_coefficient);
    }